

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O3

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  pointer ppEVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  size_type sVar4;
  SourceLocation SVar5;
  ulong uVar7;
  DiagCode code;
  ASTContext *this_00;
  long lVar8;
  Args *__range2;
  SourceRange sourceRange;
  size_t local_50;
  SourceLocation local_48;
  SourceLocation local_40;
  ASTContext *local_38;
  SourceLocation SVar6;
  
  sVar4 = args->size_;
  if (sVar4 == 0) {
    if (isMethod) {
LAB_003e3fce:
      assert::assertFailed
                ("provided",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/SystemSubroutine.cpp"
                 ,0x2f,
                 "bool slang::ast::SystemSubroutine::checkArgCount(const ASTContext &, bool, const Args &, SourceRange, size_t, size_t) const"
                );
    }
    sVar4 = 0;
    uVar7 = 0;
    this_00 = context;
    SVar6 = callRange.startLoc;
    SVar5 = callRange.endLoc;
  }
  else {
    ppEVar1 = args->data_;
    lVar8 = 0;
    local_48 = callRange.startLoc;
    local_40 = callRange.endLoc;
    local_38 = context;
    do {
      bVar2 = Expression::bad(*(Expression **)((long)ppEVar1 + lVar8));
      if (bVar2) {
        return false;
      }
      lVar8 = lVar8 + 8;
    } while (sVar4 << 3 != lVar8);
    sVar4 = args->size_;
    uVar7 = sVar4;
    this_00 = local_38;
    SVar6 = local_48;
    SVar5 = local_40;
    if (isMethod) {
      if (sVar4 == 0) goto LAB_003e3fce;
      uVar7 = sVar4 - 1;
    }
  }
  if (uVar7 < min) {
    code.subsystem = Expressions;
    code.code = 0x8c;
  }
  else {
    if (uVar7 <= max) {
      return true;
    }
    if (sVar4 <= max) {
      std::terminate();
    }
    SVar6 = (args->data_[max]->sourceRange).startLoc;
    SVar5 = (args->data_[max]->sourceRange).endLoc;
    code.subsystem = Expressions;
    code.code = 0x8d;
    min = max;
  }
  sourceRange.endLoc = SVar5;
  sourceRange.startLoc = SVar6;
  pDVar3 = ASTContext::addDiag(this_00,code,sourceRange);
  pDVar3 = Diagnostic::operator<<(pDVar3,&this->name);
  local_50 = min;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ::emplace_back<unsigned_long>(&pDVar3->args,&local_50);
  local_50 = uVar7;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
  ::emplace_back<unsigned_long>(&pDVar3->args,&local_50);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}